

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

RegSlot __thiscall
ByteCodeGenerator::EnregisterStringTemplateCallsiteConstant
          (ByteCodeGenerator *this,ParseNode *pnode)

{
  Type pFVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseNodeStrTemplate *pPVar5;
  Type *ppFVar6;
  FuncInfo *top;
  ParseNode *pPStack_18;
  RegSlot loc;
  ParseNode *pnode_local;
  ByteCodeGenerator *this_local;
  
  pPStack_18 = pnode;
  pnode_local = (ParseNode *)this;
  if (pnode->nop != knopStrTemplate) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x3f1,"(pnode->nop == knopStrTemplate)","pnode->nop == knopStrTemplate");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pPVar5 = ParseNode::AsParseNodeStrTemplate(pPStack_18);
  if ((pPVar5->field_0x2a & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x3f2,"(pnode->AsParseNodeStrTemplate()->isTaggedTemplate)",
                       "pnode->AsParseNodeStrTemplate()->isTaggedTemplate");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  top._4_4_ = 0xffffffff;
  ppFVar6 = SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Top(this->funcInfoStack);
  pFVar1 = *ppFVar6;
  bVar3 = JsUtil::
          BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<ParseNode*>
                    ((BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&pFVar1->stringTemplateCallsiteRegisterMap,&stack0xffffffffffffffe8,
                     (uint *)((long)&top + 4));
  if (!bVar3) {
    top._4_4_ = NextConstRegister(this);
    JsUtil::
    BaseDictionary<ParseNode_*,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(&pFVar1->stringTemplateCallsiteRegisterMap,&stack0xffffffffffffffe8,
          (uint *)((long)&top + 4));
  }
  return top._4_4_;
}

Assistant:

Js::RegSlot ByteCodeGenerator::EnregisterStringTemplateCallsiteConstant(ParseNode* pnode)
{
    Assert(pnode->nop == knopStrTemplate);
    Assert(pnode->AsParseNodeStrTemplate()->isTaggedTemplate);

    Js::RegSlot loc = Js::Constants::NoRegister;
    FuncInfo* top = funcInfoStack->Top();

    if (!top->stringTemplateCallsiteRegisterMap.TryGetValue(pnode, &loc))
    {
        loc = NextConstRegister();

        top->stringTemplateCallsiteRegisterMap.Add(pnode, loc);
    }

    return loc;
}